

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.cc
# Opt level: O0

size_t xemmai::t_type_of<xemmai::t_tuple>::f_do_get_at(t_object *a_this,t_pvalue *a_stack)

{
  t_object *a_object;
  t_tuple *this;
  size_t a_index;
  t_svalue *a_value;
  t_pvalue *a_stack_local;
  t_object *a_this_local;
  
  a_object = t_pointer::operator_cast_to_t_object_(&a_stack[2].super_t_pointer);
  f_check<unsigned_long>(a_object,L"index");
  this = t_object::f_as<xemmai::t_tuple>(a_this);
  a_index = f_as<unsigned_long,xemmai::t_value<xemmai::t_pointer>&>(a_stack + 2);
  a_value = t_tuple::f_get_at(this,a_index);
  t_value<xemmai::t_pointer>::operator=(a_stack,a_value);
  return 0xffffffffffffffff;
}

Assistant:

size_t t_type_of<t_tuple>::f_do_get_at(t_object* a_this, t_pvalue* a_stack)
{
	f_check<size_t>(a_stack[2], L"index");
	a_stack[0] = a_this->f_as<t_tuple>().f_get_at(f_as<size_t>(a_stack[2]));
	return -1;
}